

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  int iVar1;
  long lVar2;
  iterator iVar3;
  mapped_type_conflict *pmVar4;
  TPZGeoElSide neigh;
  key_type_conflict1 local_68;
  TPZGeoElSide local_60;
  TPZGeoElSide local_48;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_016c9948;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_016c4e58,DestMesh,&cp->super_TPZGeoEl,gl2lcElMap
                    );
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_016c4b58;
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::TPZGeoBlend(&this->fGeo,&cp->fGeo,gl2lcNdMap);
  lVar2 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar2) =
         &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar2) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar2) = 0xffffffffffffffff;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    TPZGeoElSide::TPZGeoElSide(&local_60,cp->fNeighbours + lVar2,(cp->super_TPZGeoEl).fMesh);
    while( true ) {
      iVar1 = local_60.fSide;
      local_68 = (local_60.fGeoEl)->fIndex;
      iVar3 = std::
              _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
              ::find(&gl2lcElMap->_M_t,&local_68);
      if ((_Rb_tree_header *)iVar3._M_node != &(gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header)
      break;
      TPZGeoElSide::Neighbour(&local_48,&local_60);
      local_60.fSide = local_48.fSide;
      local_60.fGeoEl = local_48.fGeoEl;
    }
    pmVar4 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             operator[](gl2lcElMap,&local_68);
    this->fNeighbours[lVar2].fGeoElIndex = *pmVar4;
    this->fNeighbours[lVar2].fSide = iVar1;
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess( TPZGeoMesh &DestMesh,
									   const TPZGeoElRefLess &cp,
									   std::map<int64_t,int64_t> & gl2lcNdMap,
									   std::map<int64_t,int64_t> & gl2lcElMap ) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp, gl2lcElMap), fGeo(cp.fGeo, gl2lcNdMap)
{
	int i;
	const int n = TGeo::NSides;
	
	for(i = 0; i < n; i++)
	{
		TPZGeoElSide neigh (cp.fNeighbours[i],cp.Mesh());
		int64_t neighIdx = neigh.Element()->Index();
		int side = neigh.Side();
		
		while (gl2lcElMap.find(neighIdx)==gl2lcElMap.end())
		{
			neigh = neigh.Neighbour();
			neighIdx = neigh.Element()->Index();
			side = neigh.Side();
		}
		this->fNeighbours[i] = TPZGeoElSideIndex ( gl2lcElMap [ neighIdx ] , side );
	}
}